

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreeview.cpp
# Opt level: O3

void QTreeView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  code *pcVar2;
  QAbstractItemViewPrivate *this;
  byte bVar3;
  undefined4 uVar4;
  long lVar5;
  int iVar6;
  QModelIndex *index;
  QWidget *this_00;
  long in_FS_OFFSET;
  void *local_28;
  void *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = _a[1];
      iVar6 = 0;
      goto LAB_005a95b4;
    case 1:
      local_20 = _a[1];
      iVar6 = 1;
LAB_005a95b4:
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_28);
      goto switchD_005a9234_caseD_10;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        hideColumn((QTreeView *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        showColumn((QTreeView *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        expand((QTreeView *)_o,(QModelIndex *)_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        collapse((QTreeView *)_o,(QModelIndex *)_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        resizeColumnToContents((QTreeView *)_o,*_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        sortByColumn((QTreeView *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        expandAll((QTreeView *)_o);
        return;
      }
      break;
    case 9:
      index = (QModelIndex *)_a[1];
      iVar6 = *_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_005a970a:
        expandRecursively((QTreeView *)_o,index,iVar6);
        return;
      }
      break;
    case 10:
      index = (QModelIndex *)_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        iVar6 = -1;
        goto LAB_005a970a;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        collapseAll((QTreeView *)_o);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        expandToDepth((QTreeView *)_o,*_a[1]);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        columnResized((QTreeView *)_o,*_a[1],0x6efae8,(int)_a);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        columnCountChanged((QTreeView *)_o,*_a[1],*_a[2]);
        return;
      }
      break;
    case 0xf:
      lVar5 = *(long *)(_o + 8);
      (**(code **)(*(long *)_o + 0x260))();
      this_00 = *(QWidget **)(lVar5 + 0x2b0);
LAB_005a96d2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QWidget::update(this_00);
        return;
      }
      break;
    default:
      goto switchD_005a9234_caseD_10;
    case 0x11:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        rowsRemoved((QTreeView *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
        return;
      }
      break;
    case 0x12:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        (**(code **)(*(long *)_o + 0x280))(_o,*_a[1]);
        return;
      }
    }
    goto LAB_005a977f;
  case ReadProperty:
    if (10 < (uint)_id) break;
    switch(_id) {
    case 0:
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x618);
      goto LAB_005a94bc;
    case 1:
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x598);
LAB_005a94bc:
      *(undefined4 *)*_a = uVar4;
      goto switchD_005a9234_caseD_10;
    case 2:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c1);
      break;
    case 3:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c0);
      break;
    case 4:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c2);
      break;
    case 5:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c3);
      break;
    case 6:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5e0);
      break;
    case 7:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c5);
      break;
    case 8:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x491);
      break;
    case 9:
      bVar3 = *(byte *)(*(long *)(*(long *)(*(long *)(_o + 8) + 0x590) + 0x20) + 10) & 1;
      break;
    case 10:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c4);
    }
    *(byte *)*_a = bVar3;
    break;
  case WriteProperty:
    if (10 < (uint)_id) break;
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      *(int *)(*(long *)(_o + 8) + 0x618) = *piVar1;
      break;
    case 1:
      lVar5 = *(long *)(_o + 8);
      if ((*(char *)(lVar5 + 0x5c6) != '\x01') || (*(int *)(lVar5 + 0x598) != *piVar1)) {
        *(int *)(lVar5 + 0x598) = *piVar1;
        *(undefined1 *)(lVar5 + 0x5c6) = 1;
        this_00 = *(QWidget **)(lVar5 + 0x2b0);
        goto LAB_005a96d2;
      }
      break;
    case 2:
      lVar5 = *(long *)(_o + 8);
      if (*(char *)(lVar5 + 0x5c1) != (char)*piVar1) {
        *(char *)(lVar5 + 0x5c1) = (char)*piVar1;
LAB_005a93b8:
        this_00 = *(QWidget **)(lVar5 + 0x2b0);
        goto LAB_005a96d2;
      }
      break;
    case 3:
      *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)*piVar1;
      break;
    case 4:
      *(char *)(*(long *)(_o + 8) + 0x5c2) = (char)*piVar1;
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setSortingEnabled((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      }
      goto LAB_005a977f;
    case 6:
      *(char *)(*(long *)(_o + 8) + 0x5e0) = (char)*piVar1;
      break;
    case 7:
      lVar5 = *(long *)(_o + 8);
      if (*(char *)(lVar5 + 0x5c5) != (char)*piVar1) {
        *(char *)(lVar5 + 0x5c5) = (char)*piVar1;
        goto LAB_005a93b8;
      }
      break;
    case 8:
      this = *(QAbstractItemViewPrivate **)(_o + 8);
      if (this->wrapItemText != SUB41(*piVar1,0)) {
        this->wrapItemText = SUB41(*piVar1,0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QAbstractItemViewPrivate::doDelayedItemsLayout(this,0);
          return;
        }
        goto LAB_005a977f;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QWidget::setHidden(*(QWidget **)(*(long *)(_o + 8) + 0x590),SUB41(*piVar1,0));
        return;
      }
      goto LAB_005a977f;
    case 10:
      *(char *)(*(long *)(_o + 8) + 0x5c4) = (char)*piVar1;
    }
    break;
  default:
    if (_id == 1 && _c == ResetProperty) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        resetIndentation((QTreeView *)_o);
        return;
      }
      goto LAB_005a977f;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar5 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == expanded && lVar5 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == collapsed && lVar5 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
switchD_005a9234_caseD_10:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_005a977f:
  __stack_chk_fail();
}

Assistant:

void QTreeView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->expanded((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->collapsed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->expand((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->collapse((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 6: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 8: _t->expandAll(); break;
        case 9: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 11: _t->collapseAll(); break;
        case 12: _t->expandToDepth((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 15: _t->columnMoved(); break;
        case 16: _t->reexpand(); break;
        case 17: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 18: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::expanded, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::collapsed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->autoExpandDelay(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->indentation(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->rootIsDecorated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->uniformRowHeights(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->itemsExpandable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->allColumnsShowFocus(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isHeaderHidden(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->expandsOnDoubleClick(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoExpandDelay(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setIndentation(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setRootIsDecorated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setUniformRowHeights(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setItemsExpandable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAllColumnsShowFocus(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setHeaderHidden(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setExpandsOnDoubleClick(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->resetIndentation(); break;
        default: break;
        }
    }
}